

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_arrayappend(HSQUIRRELVM v,SQInteger idx)

{
  SQArray *this;
  bool bVar1;
  SQInteger SVar2;
  SQObject *o;
  SQObjectPtr *local_28;
  SQObjectPtr *arr;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  arr = (SQObjectPtr *)idx;
  idx_local = (SQInteger)v;
  SVar2 = sq_gettop(v);
  if (SVar2 < 2) {
    SQVM::Raise_Error((SQVM *)idx_local,"not enough params in the stack");
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  else {
    bVar1 = sq_aux_gettypedarg((HSQUIRRELVM)idx_local,(SQInteger)arr,OT_ARRAY,&local_28);
    if (bVar1) {
      this = (local_28->super_SQObject)._unVal.pArray;
      o = &SQVM::GetUp((SQVM *)idx_local,-1)->super_SQObject;
      SQArray::Append(this,o);
      SQVM::Pop((SQVM *)idx_local);
      v_local = (HSQUIRRELVM)0x0;
    }
    else {
      v_local = (HSQUIRRELVM)0xffffffffffffffff;
    }
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_arrayappend(HSQUIRRELVM v,SQInteger idx)
{
    sq_aux_paramscheck(v,2);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    _array(*arr)->Append(v->GetUp(-1));
    v->Pop();
    return SQ_OK;
}